

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O2

int * TreePostorder(int n,int *parent)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *addr;
  int *addr_00;
  int *piVar5;
  long lVar6;
  int iVar7;
  
  iVar3 = n + 1;
  addr = mxCallocInt(iVar3);
  addr_00 = mxCallocInt(iVar3);
  piVar5 = mxCallocInt(iVar3);
  for (lVar6 = 0; uVar2 = n, lVar6 <= n; lVar6 = lVar6 + 1) {
    addr[lVar6] = -1;
  }
  while (0 < (int)uVar2) {
    uVar2 = uVar2 - 1;
    iVar3 = parent[uVar2];
    addr_00[uVar2] = addr[iVar3];
    addr[iVar3] = uVar2;
  }
  iVar3 = 0;
  iVar1 = n;
  do {
    do {
      iVar7 = iVar1;
      if (iVar3 == n) goto LAB_0010c314;
      lVar6 = (long)iVar7;
      iVar1 = addr[lVar6];
      iVar4 = iVar3;
    } while (addr[lVar6] != -1);
    while( true ) {
      piVar5[lVar6] = iVar4;
      if (addr_00[lVar6] != -1) break;
      iVar7 = parent[iVar7];
      lVar6 = (long)iVar7;
      iVar4 = iVar4 + 1;
    }
    iVar3 = iVar4 + 1;
    iVar1 = addr_00[lVar6];
  } while (n != iVar4);
LAB_0010c314:
  superlu_free(addr);
  superlu_free(addr_00);
  return piVar5;
}

Assistant:

int *TreePostorder(
		   int n,
		   int *parent
		   )
{
        int	*first_kid, *next_kid;	/* Linked list of children.	*/
        int	*post, postnum;
	int	v, dad;

	/* Allocate storage for working arrays and results	*/
	first_kid = 	mxCallocInt (n+1);
	next_kid  = 	mxCallocInt (n+1);
	post	  = 	mxCallocInt (n+1);

	/* Set up structure describing children */
	for (v = 0; v <= n; first_kid[v++] = -1);
	for (v = n-1; v >= 0; v--) {
		dad = parent[v];
		next_kid[v] = first_kid[dad];
		first_kid[dad] = v;
	}

	/* Depth-first search from dummy root vertex #n */
	postnum = 0;
#if 0
	/* recursion */
	etdfs (n, first_kid, next_kid, post, &postnum);
#else
	/* no recursion */
	nr_etdfs(n, parent, first_kid, next_kid, post, postnum);
#endif

	SUPERLU_FREE (first_kid);
	SUPERLU_FREE (next_kid);
	return post;
}